

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall
QPDF::isEncrypted(QPDF *this,int *R,int *P,int *V,encryption_method_e *stream_method,
                 encryption_method_e *string_method,encryption_method_e *file_method)

{
  char cVar1;
  long lVar2;
  int iVar3;
  longlong lVar4;
  QPDFObjectHandle encrypt;
  QPDFObjectHandle Vkey;
  QPDFObjectHandle Rkey;
  QPDFObjectHandle Pkey;
  QPDFObjectHandle trailer;
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [16];
  QPDFObjectHandle local_78;
  QPDFObjectHandle local_68;
  QPDFObjectHandle local_58;
  encryption_method_e *local_48;
  QPDF local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  cVar1 = **(char **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  if (cVar1 == '\x01') {
    local_48 = string_method;
    getTrailer(&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              (local_a8,"/Encrypt",(allocator<char> *)&local_58);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_88,(string *)&local_40);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"/P",(allocator<char> *)&local_68);
    QPDFObjectHandle::getKey(&local_58,(string *)local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"/R",(allocator<char> *)&local_78);
    QPDFObjectHandle::getKey(&local_68,(string *)local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"/V",&local_a9);
    QPDFObjectHandle::getKey(&local_78,(string *)local_88);
    std::__cxx11::string::~string(local_a8);
    lVar4 = QPDFObjectHandle::getIntValue(&local_58);
    *P = (int)lVar4;
    iVar3 = QPDFObjectHandle::getIntValueAsInt(&local_68);
    *R = iVar3;
    iVar3 = QPDFObjectHandle::getIntValueAsInt(&local_78);
    *V = iVar3;
    lVar2 = *(long *)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
    *stream_method = *(encryption_method_e *)(lVar2 + 0x40);
    *local_48 = *(encryption_method_e *)(lVar2 + 0x44);
    *file_method = *(encryption_method_e *)(lVar2 + 0x48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return (bool)cVar1;
}

Assistant:

static void
iterate_md5_digest(MD5& md5, MD5::Digest& digest, int iterations, int key_len)
{
    md5.digest(digest);

    for (int i = 0; i < iterations; ++i) {
        MD5 m;
        m.encodeDataIncrementally(reinterpret_cast<char*>(digest), QIntC::to_size(key_len));
        m.digest(digest);
    }
}